

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_checkpoint_state.cpp
# Opt level: O2

void __thiscall
duckdb::PartialBlockForCheckpoint::Merge
          (PartialBlockForCheckpoint *this,PartialBlock *other_p,idx_t offset,idx_t other_size)

{
  BufferManager *pBVar1;
  pointer pUVar2;
  _func_int **pp_Var3;
  ColumnData *data;
  ColumnSegment *segment_00;
  uint offset_in_block;
  data_ptr_t pdVar4;
  data_ptr_t __src;
  PartialColumnSegment *segment;
  _func_int **pp_Var5;
  pointer __x;
  undefined1 auVar6 [16];
  BufferHandle new_handle;
  BufferHandle old_handle;
  long lStack_70;
  BufferHandle local_60;
  BufferHandle local_48;
  
  pBVar1 = ((this->super_PartialBlock).block_manager)->buffer_manager;
  (*pBVar1->_vptr_BufferManager[7])(&local_48,pBVar1,&other_p->block_handle);
  (*pBVar1->_vptr_BufferManager[7])(&local_60,pBVar1,&(this->super_PartialBlock).block_handle);
  pdVar4 = BufferHandle::Ptr(&local_60);
  __src = BufferHandle::Ptr(&local_48);
  switchD_0193dc74::default(pdVar4 + offset,__src,other_size);
  pUVar2 = (other_p->uninitialized_regions).
           super_vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>.
           super__Vector_base<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  auVar6._8_4_ = (int)offset;
  auVar6._0_8_ = offset;
  auVar6._12_4_ = (int)(offset >> 0x20);
  for (__x = (other_p->uninitialized_regions).
             super_vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>
             .
             super__Vector_base<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>
             ._M_impl.super__Vector_impl_data._M_start; lStack_70 = auVar6._8_8_, __x != pUVar2;
      __x = __x + 1) {
    __x->start = __x->start + offset;
    __x->end = __x->end + lStack_70;
    ::std::vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>::
    push_back(&(this->super_PartialBlock).uninitialized_regions.
               super_vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>
              ,__x);
  }
  pp_Var3 = (_func_int **)other_p[1].state.block_id;
  for (pp_Var5 = other_p[1]._vptr_PartialBlock; pp_Var5 != pp_Var3; pp_Var5 = pp_Var5 + 3) {
    data = (ColumnData *)*pp_Var5;
    segment_00 = (ColumnSegment *)pp_Var5[1];
    offset_in_block =
         NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                   (*(uint *)(pp_Var5 + 2) + offset);
    AddSegmentToTail(this,data,segment_00,offset_in_block);
  }
  (*other_p->_vptr_PartialBlock[4])();
  BufferHandle::~BufferHandle(&local_60);
  BufferHandle::~BufferHandle(&local_48);
  return;
}

Assistant:

void PartialBlockForCheckpoint::Merge(PartialBlock &other_p, idx_t offset, idx_t other_size) {
	auto &other = other_p.Cast<PartialBlockForCheckpoint>();

	auto &buffer_manager = block_manager.buffer_manager;
	// pin the source block
	auto old_handle = buffer_manager.Pin(other.block_handle);
	// pin the target block
	auto new_handle = buffer_manager.Pin(block_handle);
	// memcpy the contents of the old block to the new block
	memcpy(new_handle.Ptr() + offset, old_handle.Ptr(), other_size);

	// now copy over all segments to the new block
	// move over the uninitialized regions
	for (auto &region : other.uninitialized_regions) {
		region.start += offset;
		region.end += offset;
		uninitialized_regions.push_back(region);
	}

	// move over the segments
	for (auto &segment : other.segments) {
		AddSegmentToTail(segment.data, segment.segment, NumericCast<uint32_t>(segment.offset_in_block + offset));
	}

	other.Clear();
}